

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeProperty.cpp
# Opt level: O2

float Rml::ComputeFontsize
                (NumericValue value,ComputedValues *values,ComputedValues *parent_values,
                ComputedValues *document_values,float dp_ratio,Vector2f vp_dimensions)

{
  Unit UVar1;
  ComputedValues *pCVar2;
  float fVar3;
  float fVar4;
  
  fVar4 = value.number;
  if (((ulong)value >> 0x20 & 0x1820) != 0) {
    UVar1 = value.unit;
    if (UVar1 == REM) {
      if (document_values == (ComputedValues *)0x0 || values == document_values) {
        pCVar2 = DefaultComputedValues();
        return fVar4 * (pCVar2->inherited).font_size;
      }
      return fVar4 * (document_values->inherited).font_size;
    }
    if (UVar1 == EM) {
      fVar3 = 1.0;
    }
    else {
      if (UVar1 != PERCENT) goto LAB_002549ff;
      fVar3 = 0.01;
    }
    if (parent_values != (ComputedValues *)0x0) {
      return fVar3 * fVar4 * (parent_values->inherited).font_size;
    }
    return 0.0;
  }
LAB_002549ff:
  fVar4 = ComputeLength(value,0.0,0.0,dp_ratio,vp_dimensions);
  return fVar4;
}

Assistant:

float ComputeFontsize(NumericValue value, const Style::ComputedValues& values, const Style::ComputedValues* parent_values,
	const Style::ComputedValues* document_values, float dp_ratio, Vector2f vp_dimensions)
{
	if (Any(value.unit & (Unit::PERCENT | Unit::EM | Unit::REM)))
	{
		// Relative values are based on the parent's or document's font size instead of our own.
		float multiplier = 1.0f;

		switch (value.unit)
		{
		case Unit::PERCENT:
			multiplier = 0.01f;
			//-fallthrough
		case Unit::EM:
			if (!parent_values)
				return 0;
			return value.number * multiplier * parent_values->font_size();

		case Unit::REM:
			// If the current element is a document, the rem unit is relative to the default size.
			if (!document_values || &values == document_values)
				return value.number * DefaultComputedValues().font_size();

			// Otherwise it is relative to the document font size.
			return value.number * document_values->font_size();
		default: break;
		}
	}

	// Font-relative lengths handled above, other lengths should be handled as normal.
	return ComputeLength(value, 0.f, 0.f, dp_ratio, vp_dimensions);
}